

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::analysis::ConstantManager::FindDeclaredConstant
          (ConstantManager *this,Constant *c,uint32_t type_id)

{
  uint32_t uVar1;
  DefUseManager *this_00;
  Instruction *this_01;
  _Rb_tree_const_iterator<std::pair<const_spvtools::opt::analysis::Constant_*const,_unsigned_int>_>
  _Var2;
  _Rb_tree_const_iterator<std::pair<const_spvtools::opt::analysis::Constant_*const,_unsigned_int>_>
  _Var3;
  pair<std::_Rb_tree_const_iterator<std::pair<const_spvtools::opt::analysis::Constant_*const,_unsigned_int>_>,_std::_Rb_tree_const_iterator<std::pair<const_spvtools::opt::analysis::Constant_*const,_unsigned_int>_>_>
  pVar4;
  Constant *local_38;
  
  local_38 = FindConstant(this,c);
  if (local_38 != (Constant *)0x0) {
    pVar4 = std::
            _Rb_tree<const_spvtools::opt::analysis::Constant_*,_std::pair<const_spvtools::opt::analysis::Constant_*const,_unsigned_int>,_std::_Select1st<std::pair<const_spvtools::opt::analysis::Constant_*const,_unsigned_int>_>,_std::less<const_spvtools::opt::analysis::Constant_*>,_std::allocator<std::pair<const_spvtools::opt::analysis::Constant_*const,_unsigned_int>_>_>
            ::equal_range(&(this->const_val_to_id_)._M_t,&local_38);
    for (_Var2._M_node = pVar4.first._M_node._M_node; _Var2._M_node != pVar4.second._M_node._M_node;
        _Var2._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var2._M_node)) {
      this_00 = IRContext::get_def_use_mgr(this->ctx_);
      this_01 = DefUseManager::GetDef(this_00,*(uint32_t *)&_Var2._M_node[1]._M_parent);
      _Var3._M_node = pVar4.first._M_node._M_node;
      if ((type_id == 0) ||
         (uVar1 = Instruction::type_id(this_01), _Var3._M_node = _Var2._M_node, uVar1 == type_id)) {
        return *(uint32_t *)&_Var3._M_node[1]._M_parent;
      }
    }
  }
  return 0;
}

Assistant:

uint32_t ConstantManager::FindDeclaredConstant(const Constant* c,
                                               uint32_t type_id) const {
  c = FindConstant(c);
  if (c == nullptr) {
    return 0;
  }

  for (auto range = const_val_to_id_.equal_range(c);
       range.first != range.second; ++range.first) {
    Instruction* const_def =
        context()->get_def_use_mgr()->GetDef(range.first->second);
    if (type_id == 0 || const_def->type_id() == type_id) {
      return range.first->second;
    }
  }
  return 0;
}